

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TPZGeoBlend(TPZGeoBlend<pzgeom::TPZGeoTriangle> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZGeoElSideIndex *in_stack_ffffffffffffff60;
  void **in_stack_ffffffffffffff68;
  TPZGeoTriangle *in_stack_ffffffffffffff70;
  TPZTransform<double> *in_stack_ffffffffffffff80;
  TPZRegisterClassId *local_58;
  TPZRegisterClassId *local_30;
  
  TPZRegisterClassId::TPZRegisterClassId<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>>(in_RDI,0x21);
  TPZGeoTriangle::TPZGeoTriangle(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *(undefined ***)in_RDI = &PTR__TPZGeoBlend_0244ff30;
  local_30 = in_RDI + 0x28;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff60);
    local_30 = local_30 + 0x18;
  } while (local_30 != in_RDI + 0xa0);
  local_58 = in_RDI + 0xa0;
  do {
    TPZTransform<double>::TPZTransform(in_stack_ffffffffffffff80);
    local_58 = local_58 + 0x1a0;
  } while (local_58 != in_RDI + 0x8c0);
  return;
}

Assistant:

TPZGeoBlend() : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                        TGeo() {
        }